

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void AES_decrypt(uchar *in,uchar *out,AES_KEY *key)

{
  undefined8 in_RCX;
  int local_3c;
  undefined1 local_38 [4];
  int round;
  AES_state s;
  uchar *cipher16_local;
  uchar *plain16_local;
  AES_state *pAStack_10;
  int nrounds_local;
  AES_state *rounds_local;
  
  s.slice._8_8_ = in_RCX;
  memset(local_38,0,0x10);
  pAStack_10 = (AES_state *)(in + (long)(int)out * 0x10);
  LoadBytes((AES_state *)local_38,(uchar *)s.slice._8_8_);
  AddRoundKey((AES_state *)local_38,pAStack_10);
  for (local_3c = 1; pAStack_10 = pAStack_10 + -1, local_3c < (int)out; local_3c = local_3c + 1) {
    InvShiftRows((AES_state *)local_38);
    SubBytes((AES_state *)local_38,1);
    AddRoundKey((AES_state *)local_38,pAStack_10);
    MixColumns((AES_state *)local_38,1);
  }
  InvShiftRows((AES_state *)local_38);
  SubBytes((AES_state *)local_38,1);
  AddRoundKey((AES_state *)local_38,pAStack_10);
  SaveBytes((uchar *)key,(AES_state *)local_38);
  return;
}

Assistant:

static void AES_decrypt(const AES_state* rounds, int nrounds, unsigned char* plain16, const unsigned char* cipher16) {
    /* Most AES decryption implementations use the alternate scheme
     * (the Equivalent Inverse Cipher), which allows for more code reuse between
     * the encryption and decryption code, but requires separate setup for both.
     */
    AES_state s = {{0}};
    int round;

    rounds += nrounds;

    LoadBytes(&s, cipher16);
    AddRoundKey(&s, rounds--);

    for (round = 1; round < nrounds; round++) {
        InvShiftRows(&s);
        SubBytes(&s, 1);
        AddRoundKey(&s, rounds--);
        MixColumns(&s, 1);
    }

    InvShiftRows(&s);
    SubBytes(&s, 1);
    AddRoundKey(&s, rounds);

    SaveBytes(plain16, &s);
}